

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uTimer.cpp
# Opt level: O1

void __thiscall UTimer::UTimer(UTimer *this,string *m)

{
  pointer pcVar1;
  rep rVar2;
  
  (this->start).__d.__r = 0;
  (this->stop).__d.__r = 0;
  (this->message)._M_dataplus._M_p = (pointer)&(this->message).field_2;
  pcVar1 = (m->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->message,pcVar1,pcVar1 + m->_M_string_length);
  rVar2 = std::chrono::_V2::system_clock::now();
  (this->start).__d.__r = rVar2;
  return;
}

Assistant:

UTimer::UTimer (const std::string m) : message(m) {
	start		= std::chrono::high_resolution_clock::now();
}